

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxSpecific.cpp
# Opt level: O1

int getEthernetRate(int sock,ifreq *item)

{
  int iVar1;
  uint uVar2;
  ethtool_cmd eth_data;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  uStack_28 = 0;
  uStack_24 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  local_2c = 0;
  uStack_40 = 0;
  (item->ifr_ifru).ifru_data = &local_48;
  local_48 = 1;
  iVar1 = ioctl(sock,0x8946,item);
  uVar2 = (uint)uStack_40._4_2_;
  if (iVar1 < 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int getEthernetRate(int sock, struct ifreq * item)
{
    struct ethtool_cmd eth_data = {0};
    item->ifr_data=(char *)&eth_data;
    eth_data.cmd = ETHTOOL_GSET; /* get setting */
    if (ioctl(sock, SIOCETHTOOL, item) >= 0)
        return eth_data.speed;
    return 0;
}